

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeGetNumStabLimOrderReds(void *cvode_mem,long *nslred)

{
  long lVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumStabLimOrderReds",
                   "cvode_mem = NULL illegal.");
  }
  else {
    iVar2 = 0;
    if (*(int *)((long)cvode_mem + 0x498) == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)((long)cvode_mem + 0x568);
    }
    *nslred = lVar1;
  }
  return iVar2;
}

Assistant:

int CVodeGetNumStabLimOrderReds(void *cvode_mem, long int *nslred)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumStabLimOrderReds", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->cv_sldeton==SUNFALSE)
    *nslred = 0;
  else
    *nslred = cv_mem->cv_nor;

  return(CV_SUCCESS);
}